

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettify.h
# Opt level: O2

size_t floaxie::print_decimal<char>(char *buffer,uint len,int k)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t __n;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = k + len;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  iVar5 = (int)uVar6;
  uVar1 = iVar5 - (k >> 0x1f);
  if ((int)uVar3 < 1) {
    uVar1 = 2 - uVar3;
  }
  uVar2 = 2 - uVar3;
  if (0 < (int)uVar3) {
    uVar2 = 0;
  }
  uVar4 = 1;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  __n = (size_t)(uint)k;
  if (k < 1) {
    __n = 0;
  }
  uVar3 = len - iVar5;
  if ((int)(len - iVar5) < 1) {
    uVar3 = 0;
  }
  uVar7 = (ulong)((((int)__n + len) - iVar5) + uVar1);
  memmove(buffer + uVar1,buffer + uVar6,(ulong)uVar3);
  memset(buffer,0x30,(ulong)uVar2);
  memset(buffer + len,0x30,__n);
  buffer[uVar4] = '.';
  buffer[uVar7] = '\0';
  return uVar7;
}

Assistant:

inline std::size_t print_decimal(CharType* buffer, const unsigned int len, const int k) noexcept
	{
		const int dot_pos = static_cast<int>(len) + k;

		const unsigned int actual_dot_pos = dot_pos > 0 ? uint32_t(dot_pos) : 1;

		const unsigned int left_offset = dot_pos > 0 ? 0 : 2 - uint32_t(dot_pos);
		const unsigned int right_offset = positive_part(k);

		const unsigned int left_shift_src = positive_part(dot_pos);
		const unsigned int left_shift_dest = dot_pos > 0 ? left_shift_src + (k < 0) : left_offset;
		const unsigned int left_shift_len = positive_part(static_cast<int>(len) - static_cast<int>(left_shift_src));

		const unsigned int term_pos = len + right_offset + (left_shift_dest - left_shift_src);

		wrap::memmove(buffer + left_shift_dest, buffer + left_shift_src, left_shift_len);
		wrap::memset(buffer, CharType('0'), left_offset);
		wrap::memset(buffer + len, CharType('0'), right_offset);
		buffer[actual_dot_pos] = '.';
		buffer[term_pos] = '\0';

		return term_pos;
	}